

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O1

void __thiscall DListMenu::Drawer(DListMenu *this)

{
  int iVar1;
  FListMenuItem *pFVar2;
  FListMenuDescriptor *pFVar3;
  uint uVar4;
  ulong uVar5;
  
  pFVar3 = this->mDesc;
  uVar4 = (pFVar3->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count;
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      pFVar2 = (pFVar3->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar5];
      if (pFVar2->mEnabled == true) {
        (*pFVar2->_vptr_FListMenuItem[4])(pFVar2,(ulong)(uVar5 == (uint)pFVar3->mSelectedItem));
      }
      uVar5 = uVar5 + 1;
      pFVar3 = this->mDesc;
      uVar4 = (pFVar3->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count;
    } while (uVar5 < uVar4);
  }
  iVar1 = pFVar3->mSelectedItem;
  if ((-1 < (long)iVar1) && (iVar1 < (int)uVar4)) {
    FListMenuItem::DrawSelector
              ((pFVar3->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[iVar1],
               pFVar3->mSelectOfsX,pFVar3->mSelectOfsY,(FTextureID)(pFVar3->mSelector).texnum);
  }
  DMenu::Drawer(&this->super_DMenu);
  return;
}

Assistant:

void DListMenu::Drawer ()
{
	for(unsigned i=0;i<mDesc->mItems.Size(); i++)
	{
		if (mDesc->mItems[i]->mEnabled) mDesc->mItems[i]->Drawer(mDesc->mSelectedItem == (int)i);
	}
	if (mDesc->mSelectedItem >= 0 && mDesc->mSelectedItem < (int)mDesc->mItems.Size())
		mDesc->mItems[mDesc->mSelectedItem]->DrawSelector(mDesc->mSelectOfsX, mDesc->mSelectOfsY, mDesc->mSelector);
	Super::Drawer();
}